

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_16::NameResolver::BeginTryTableExpr(NameResolver *this,TryTableExpr *expr)

{
  pointer pTVar1;
  TableCatch *catch_;
  pointer pTVar2;
  
  pTVar1 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar2 = (expr->catches).
                super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    if ((pTVar2->kind & ~CatchRef) != CatchAll) {
      ResolveTagVar(this,&pTVar2->tag);
    }
    ResolveLabelVar(this,&pTVar2->target);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->labels_,&(expr->block).label);
  ResolveBlockDeclarationVar(this,&(expr->block).decl);
  return (Result)Ok;
}

Assistant:

Result NameResolver::BeginTryTableExpr(TryTableExpr* expr) {
  for (TableCatch& catch_ : expr->catches) {
    if (!catch_.IsCatchAll()) {
      ResolveTagVar(&catch_.tag);
    }
    ResolveLabelVar(&catch_.target);
  }
  PushLabel(expr->block.label);
  ResolveBlockDeclarationVar(&expr->block.decl);
  return Result::Ok;
}